

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::str::str(str *this,object *o)

{
  bool bVar1;
  handle *this_00;
  PyObject *op;
  error_already_set *this_01;
  PyObject *local_50;
  handle local_20;
  handle *local_18;
  object *o_local;
  str *this_local;
  
  local_18 = &o->super_handle;
  o_local = &this->super_object;
  bVar1 = check_((o->super_handle).m_ptr);
  if (bVar1) {
    this_00 = handle::inc_ref(local_18);
    local_50 = handle::ptr(this_00);
  }
  else {
    op = handle::ptr(local_18);
    local_50 = raw_str(op);
  }
  handle::handle(&local_20,local_50);
  object::object(&this->super_object,local_20.m_ptr);
  if ((this->super_object).super_handle.m_ptr == (PyObject *)0x0) {
    this_01 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_01);
    __cxa_throw(this_01,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  return;
}

Assistant:

str(const char *c, size_t n)
        : object(PyUnicode_FromStringAndSize(c, (ssize_t) n), stolen_t{}) {
        if (!m_ptr) pybind11_fail("Could not allocate string object!");
    }